

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationUtil.cpp
# Opt level: O0

int vkt::tessellation::referencePointModePrimitiveCount
              (TessPrimitiveType primitiveType,SpacingMode spacingMode,float *innerLevels,
              float *outerLevels)

{
  bool bVar1;
  size_type sVar2;
  vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> local_a0;
  int local_88;
  int local_84;
  int outer_2 [2];
  int local_68;
  int local_64;
  int outer_1 [4];
  int inner_1 [2];
  int local_38;
  int local_34;
  int outer [3];
  int inner;
  float *outerLevels_local;
  float *innerLevels_local;
  SpacingMode spacingMode_local;
  TessPrimitiveType primitiveType_local;
  
  unique0x10000194 = outerLevels;
  bVar1 = isPatchDiscarded(primitiveType,outerLevels);
  if (bVar1) {
    spacingMode_local = SPACINGMODE_EQUAL;
  }
  else if (primitiveType == TESSPRIMITIVETYPE_TRIANGLES) {
    getClampedRoundedTriangleTessLevels
              (spacingMode,innerLevels,stack0xffffffffffffffd8,outer + 1,&local_38);
    generateReferenceTriangleTessCoords
              ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)inner_1,
               spacingMode,outer[1],local_38,local_34,outer[0]);
    sVar2 = std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::size
                      ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)
                       inner_1);
    spacingMode_local = (SpacingMode)sVar2;
    std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::~vector
              ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)inner_1);
  }
  else if (primitiveType == TESSPRIMITIVETYPE_QUADS) {
    getClampedRoundedQuadTessLevels
              (spacingMode,innerLevels,stack0xffffffffffffffd8,outer_1 + 2,&local_68);
    generateReferenceQuadTessCoords
              ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)outer_2,
               spacingMode,outer_1[2],outer_1[3],local_68,local_64,outer_1[0],outer_1[1]);
    sVar2 = std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::size
                      ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)
                       outer_2);
    spacingMode_local = (SpacingMode)sVar2;
    std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::~vector
              ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)outer_2);
  }
  else if (primitiveType == TESSPRIMITIVETYPE_ISOLINES) {
    getClampedRoundedIsolineTessLevels(spacingMode,stack0xffffffffffffffd8,&local_88);
    generateReferenceIsolineTessCoords(&local_a0,local_88,local_84);
    sVar2 = std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::size
                      (&local_a0);
    spacingMode_local = (SpacingMode)sVar2;
    std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::~vector(&local_a0);
  }
  else {
    spacingMode_local = SPACINGMODE_EQUAL;
  }
  return spacingMode_local;
}

Assistant:

static int referencePointModePrimitiveCount (const TessPrimitiveType primitiveType, const SpacingMode spacingMode, const float* innerLevels, const float* outerLevels)
{
	if (isPatchDiscarded(primitiveType, outerLevels))
		return 0;

	switch (primitiveType)
	{
		case TESSPRIMITIVETYPE_TRIANGLES:
		{
			int inner;
			int outer[3];
			getClampedRoundedTriangleTessLevels(spacingMode, innerLevels, outerLevels, &inner, &outer[0]);
			return static_cast<int>(generateReferenceTriangleTessCoords(spacingMode, inner, outer[0], outer[1], outer[2]).size());
		}

		case TESSPRIMITIVETYPE_QUADS:
		{
			int inner[2];
			int outer[4];
			getClampedRoundedQuadTessLevels(spacingMode, innerLevels, outerLevels, &inner[0], &outer[0]);
			return static_cast<int>(generateReferenceQuadTessCoords(spacingMode, inner[0], inner[1], outer[0], outer[1], outer[2], outer[3]).size());
		}

		case TESSPRIMITIVETYPE_ISOLINES:
		{
			int outer[2];
			getClampedRoundedIsolineTessLevels(spacingMode, &outerLevels[0], &outer[0]);
			return static_cast<int>(generateReferenceIsolineTessCoords(outer[0], outer[1]).size());
		}

		default:
			DE_ASSERT(false);
			return 0;
	}
}